

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalExpressionSyntax,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ConditionalPredicateSyntax *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3,
          Token *args_4,ExpressionSyntax *args_5)

{
  Token colon;
  Token question;
  ConditionalExpressionSyntax *pCVar1;
  ConditionalExpressionSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  ConditionalPredicateSyntax *in_R8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R9;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  ExpressionSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pCVar1 = (ConditionalExpressionSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  question.info = in_RSI;
  question.kind = (short)in_RDX;
  question._2_1_ = (char)((ulong)in_RDX >> 0x10);
  question.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  question.rawLen = (int)((ulong)in_RDX >> 0x20);
  colon.info = in_stack_00000008;
  colon.kind = (short)unaff_retaddr;
  colon._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  colon.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  colon.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::ConditionalExpressionSyntax::ConditionalExpressionSyntax
            (in_RCX,in_R8,question,in_R9,*(ExpressionSyntax **)(in_RDX + 8),colon,in_stack_00000010)
  ;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }